

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void divide_nalus(void)

{
  ulong uVar1;
  ulong uStack_10;
  uint32_t re_buf_cache;
  uint64_t i;
  
  uStack_10 = 0;
  while (uStack_10 < buf_size - 6) {
    if (*(int *)(buf + uStack_10) == 0x1000000) {
      uVar1 = (ulong)au_pos;
      au_pos = au_pos + 1;
      au_buf[uVar1] = uStack_10 + 1;
      uStack_10 = uStack_10 + 4;
    }
    else {
      uStack_10 = uStack_10 + 1;
    }
  }
  return;
}

Assistant:

void divide_nalus()
{

    for(uint64_t i = 0; i < buf_size - 6;)
    {
        uint32_t re_buf_cache = *((uint32_t *)(buf + i));
        if(0x01000000 == re_buf_cache)
        {
            au_buf[au_pos++] = i + 1;
            i += 4;
        }
        else
            i++;
    }
}